

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O2

void pzshape::TPZShapePrism::ShapeInternal
               (TPZVec<double> *x,int order,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  ulong row;
  int j;
  ulong row_00;
  int iVar5;
  int i;
  ulong row_01;
  int k;
  ulong row_02;
  ulong row_03;
  long row_04;
  TPZFNMatrix<20,_double> phi2;
  TPZFNMatrix<20,_double> phi1;
  TPZFNMatrix<20,_double> phi0;
  TPZFNMatrix<20,_double> dphi2;
  TPZFNMatrix<20,_double> dphi1;
  TPZFNMatrix<20,_double> dphi0;
  
  if (2 < order) {
    row = (ulong)(order - 2U);
    TPZFNMatrix<20,_double>::TPZFNMatrix(&phi0,row,1);
    TPZFNMatrix<20,_double>::TPZFNMatrix(&phi1,row,1);
    row_02 = (ulong)(order - 1U);
    TPZFNMatrix<20,_double>::TPZFNMatrix(&phi2,row_02,1);
    TPZFNMatrix<20,_double>::TPZFNMatrix(&dphi0,1,row);
    TPZFNMatrix<20,_double>::TPZFNMatrix(&dphi1,1,row);
    TPZFNMatrix<20,_double>::TPZFNMatrix(&dphi2,1,row_02);
    (*(code *)TPZShapeLinear::fOrthogonal)(*x->fStore + *x->fStore + -1.0,row,&phi0,&dphi0);
    (*(code *)TPZShapeLinear::fOrthogonal)(x->fStore[1] + x->fStore[1] + -1.0,row,&phi1,&dphi1);
    (*(code *)TPZShapeLinear::fOrthogonal)(x->fStore[2],order - 1U,&phi2,&dphi2);
    iVar5 = 0;
    for (row_01 = 0; row_01 != row; row_01 = row_01 + 1) {
      for (row_00 = 0; row_00 != row; row_00 = row_00 + 1) {
        for (row_03 = 0; row_02 != row_03; row_03 = row_03 + 1) {
          if ((int)row_00 + (int)row_01 < (int)(order - 2U)) {
            pdVar4 = TPZFMatrix<double>::operator()(&phi0.super_TPZFMatrix<double>,row_01,0);
            dVar1 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(&phi1.super_TPZFMatrix<double>,row_00,0);
            dVar2 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(&phi2.super_TPZFMatrix<double>,row_03,0);
            dVar3 = *pdVar4;
            row_04 = (long)iVar5;
            pdVar4 = TPZFMatrix<double>::operator()(phi,row_04,0);
            *pdVar4 = dVar1 * dVar2 * dVar3;
            pdVar4 = TPZFMatrix<double>::operator()(&dphi0.super_TPZFMatrix<double>,0,row_01);
            dVar1 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(&phi1.super_TPZFMatrix<double>,row_00,0);
            dVar2 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(&phi2.super_TPZFMatrix<double>,row_03,0);
            dVar3 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(dphi,0,row_04);
            *pdVar4 = (dVar1 + dVar1) * dVar2 * dVar3;
            pdVar4 = TPZFMatrix<double>::operator()(&phi0.super_TPZFMatrix<double>,row_01,0);
            dVar1 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(&dphi1.super_TPZFMatrix<double>,0,row_00);
            dVar2 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(&phi2.super_TPZFMatrix<double>,row_03,0);
            dVar3 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(dphi,1,row_04);
            *pdVar4 = (dVar1 + dVar1) * dVar2 * dVar3;
            pdVar4 = TPZFMatrix<double>::operator()(&phi0.super_TPZFMatrix<double>,row_01,0);
            dVar1 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(&phi1.super_TPZFMatrix<double>,row_00,0);
            dVar2 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(&dphi2.super_TPZFMatrix<double>,0,row_03);
            dVar3 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()(dphi,2,row_04);
            *pdVar4 = dVar1 * dVar2 * dVar3;
            iVar5 = iVar5 + 1;
          }
        }
      }
    }
    TPZFNMatrix<20,_double>::~TPZFNMatrix(&dphi2);
    TPZFNMatrix<20,_double>::~TPZFNMatrix(&dphi1);
    TPZFNMatrix<20,_double>::~TPZFNMatrix(&dphi0);
    TPZFNMatrix<20,_double>::~TPZFNMatrix(&phi2);
    TPZFNMatrix<20,_double>::~TPZFNMatrix(&phi1);
    TPZFNMatrix<20,_double>::~TPZFNMatrix(&phi0);
  }
  return;
}

Assistant:

void TPZShapePrism::ShapeInternal(TPZVec<REAL> &x, int order,TPZFMatrix<REAL> &phi,
									  TPZFMatrix<REAL> &dphi) {
		//valor da fun��o e derivada do produto das fun��es ortogonais
		if(order < 3) return;
		int ord1 = order-2;
		int ord2 = order-1;
		
		TPZFNMatrix<20,REAL> phi0(ord1,1),phi1(ord1,1),phi2(ord2,1),
		dphi0(1,ord1),dphi1(1,ord1),dphi2(1,ord2);
		TPZShapeLinear::fOrthogonal(2.*x[0]-1.,ord1,phi0,dphi0);//f e df       0<=x0<=1 -> -1<=2*x0-1<=1
		TPZShapeLinear::fOrthogonal(2.*x[1]-1.,ord1,phi1,dphi1);//g e dg             0<=x1<=1 -> -1<=2*x1-1<=1
		TPZShapeLinear::fOrthogonal(x[2],ord2,phi2,dphi2);//h e dh      -1<=x3<=1
		int index = 0;//x � ponto de integra��o dentro da pir�mide
		for (int i=0;i<ord1;i++) {
			for (int j=0;j<ord1;j++) {
				for (int k=0;k<ord2;k++) {
					if( i+j < ord1 && k < ord2) {
						phi(index,0) =     phi0(i,0)* phi1(j,0)* phi2(k,0);
						dphi(0,index) = 2.*dphi0(0,i)* phi1(j,0)* phi2(k,0);
						dphi(1,index) =  2.*phi0(i,0)*dphi1(0,j)* phi2(k,0);
						dphi(2,index) =     phi0(i,0)* phi1(j,0)*dphi2(0,k);
						index++;
					}
				}
			}
		}
	}